

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpticalFlowFrameToFrame.h
# Opt level: O0

void __thiscall
vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::trackPoints
          (OpticalFlowFrameToFrame<float,_vo::Pattern51> *this,
          ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_1,
          ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_2,
          aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_1,
          aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_2)

{
  bool bVar1;
  size_type __n;
  reference __x;
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  blocked_range<unsigned_long> range;
  anon_class_48_6_1519dfa4 compute_func;
  concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  result;
  pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_> *kv;
  const_iterator __end2;
  const_iterator __begin2;
  aligned_map<KeypointId,_Eigen::AffineCompact2f> *__range2;
  undefined1 local_68 [8];
  aligned_vector<Eigen::AffineCompact2f> init_vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  size_t num_points;
  aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_2_local;
  aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_1_local;
  ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_2_local;
  ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_1_local;
  OpticalFlowFrameToFrame<float,_vo::Pattern51> *this_local;
  
  __n = std::
        map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
        ::size(transform_map_1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &init_vec.
              super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ::vector((vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
            *)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &init_vec.
              super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
  std::
  vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ::reserve((vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
             *)local_68,__n);
  __end2 = std::
           map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
           ::begin(transform_map_1);
  kv = (pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_> *)
       std::
       map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
       ::end(transform_map_1);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&kv);
    if (!bVar1) break;
    __x = std::
          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>
          ::operator*(&__end2);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &init_vec.
                super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&__x->first);
    std::
    vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
    ::push_back((vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
                 *)local_68,&__x->second);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>::
    operator++(&__end2);
  }
  tbb::detail::d1::
  concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  ::concurrent_unordered_map
            ((concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
              *)&compute_func.result);
  range.my_grainsize =
       (size_type)
       &init_vec.
        super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  compute_func.ids = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68;
  compute_func.pyr_2 =
       (ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *)&compute_func.result;
  compute_func.init_vec = (aligned_vector<Eigen::AffineCompact2f> *)this;
  compute_func.this = (OpticalFlowFrameToFrame<float,_vo::Pattern51> *)pyr_1;
  compute_func.pyr_1 = pyr_2;
  tbb::detail::d1::blocked_range<unsigned_long>::blocked_range
            ((blocked_range<unsigned_long> *)local_330,0,__n,1);
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,vo::OpticalFlowFrameToFrame<float,vo::Pattern51>::trackPoints(vo::ManagedImagePyr<unsigned_short,std::allocator<unsigned_short>>const&,vo::ManagedImagePyr<unsigned_short,std::allocator<unsigned_short>>const&,std::map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>const&,std::map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>&)const::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            ((blocked_range<unsigned_long> *)local_330,
             (anon_class_48_6_1519dfa4 *)&range.my_grainsize);
  std::
  map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  ::clear(transform_map_2);
  tbb::detail::d1::
  concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
  ::begin((concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
           *)(local_340 + 8));
  tbb::detail::d1::
  concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
  ::end((concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
         *)local_340);
  std::
  map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
  ::
  insert<tbb::detail::d1::solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,Eigen::Transform<float,2,18,0>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,tbb::detail::d1::tbb_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>,false>>,std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
            ((map<unsigned_long,Eigen::Transform<float,2,18,0>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
              *)transform_map_2,
             (solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>
              *)(local_340 + 8),
             (solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>
              *)local_340);
  tbb::detail::d1::
  concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  ::~concurrent_unordered_map
            ((concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
              *)&compute_func.result);
  std::
  vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ::~vector((vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
             *)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &init_vec.
              super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void trackPoints(const vo::ManagedImagePyr<u_int16_t>& pyr_1,
                   const vo::ManagedImagePyr<u_int16_t>& pyr_2,
                   const Eigen::aligned_map<KeypointId, Eigen::AffineCompact2f>&
                       transform_map_1,
                   Eigen::aligned_map<KeypointId, Eigen::AffineCompact2f>&
                       transform_map_2) const {
    size_t num_points = transform_map_1.size();

    std::vector<KeypointId> ids;
    Eigen::aligned_vector<Eigen::AffineCompact2f> init_vec;

    ids.reserve(num_points);
    init_vec.reserve(num_points);

    for (const auto& kv : transform_map_1) {
      ids.push_back(kv.first);
      init_vec.push_back(kv.second);
    }

    tbb::concurrent_unordered_map<KeypointId, Eigen::AffineCompact2f,
                                  std::hash<KeypointId>>
        result;

    auto compute_func = [&](const tbb::blocked_range<size_t>& range) {
      for (size_t r = range.begin(); r != range.end(); ++r) {
        const KeypointId id = ids[r];

        const Eigen::AffineCompact2f& transform_1 = init_vec[r];
        Eigen::AffineCompact2f transform_2 = transform_1;

        bool valid = trackPoint(pyr_1, pyr_2, transform_1, transform_2);

        if (valid) {
          Eigen::AffineCompact2f transform_1_recovered = transform_2;

          valid = trackPoint(pyr_2, pyr_1, transform_2, transform_1_recovered);

          if (valid) {
            Scalar dist2 = (transform_1.translation() -
                            transform_1_recovered.translation())
                               .squaredNorm();

            if (dist2 < optical_flow_max_recovered_dist2) {
              result[id] = transform_2;
            }
          }
        }
      }
    };

    tbb::blocked_range<size_t> range(0, num_points);

    tbb::parallel_for(range, compute_func);
    // compute_func(range);

    transform_map_2.clear();
    transform_map_2.insert(result.begin(), result.end());
  }